

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

string * cs::get_import_path_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string base_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = getenv("CS_IMPORT_PATH");
  get_sdk_path_abi_cxx11_();
  std::operator+(&local_b8,&local_98,'/');
  std::operator+(&base_path,&local_b8,"imports");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_38,"/usr/share/covscript",&local_b9);
  std::operator+(&local_78,':',&local_38);
  std::operator+(&local_98,&local_78,'/');
  std::operator+(&local_b8,&local_98,"imports");
  std::__cxx11::string::append((string *)&base_path);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  if (pcVar1 == (char *)0x0) {
    process_path(in_RDI,&base_path);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,pcVar1,(allocator *)&local_38);
    std::operator+(&local_98,&local_78,':');
    std::operator+(&local_b8,&local_98,&base_path);
    process_path(in_RDI,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&base_path);
  return in_RDI;
}

Assistant:

std::string get_import_path()
	{
		const char *import_path = std::getenv("CS_IMPORT_PATH");
		std::string base_path = get_sdk_path() + cs::path_separator + "imports";
		base_path += cs::path_delimiter + std::string(COVSCRIPT_PLATFORM_HOME) + cs::path_separator + "imports";
		if (import_path != nullptr)
			return process_path(std::string(import_path) + cs::path_delimiter + base_path);
		else
			return process_path(base_path);
	}